

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O2

void __thiscall cmComputeComponentGraph::TarjanVisit(cmComputeComponentGraph *this,int i)

{
  int iVar1;
  pointer pTVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  _Elt_pointer piVar7;
  int iVar8;
  cmGraphEdge *ni;
  pointer pcVar9;
  vector<int,_std::allocator<int>_> *this_00;
  int j;
  int i_local;
  
  (this->TarjanVisited).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[i] = this->TarjanWalkId;
  pTVar2 = (this->TarjanEntries).
           super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar2[i].Root = i;
  (this->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[i] = -1;
  iVar8 = this->TarjanIndex + 1;
  this->TarjanIndex = iVar8;
  pTVar2[i].VisitIndex = iVar8;
  i_local = i;
  std::deque<int,_std::allocator<int>_>::push_back(&(this->TarjanStack).c,&i_local);
  pcVar3 = (this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
           super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar9 = *(pointer *)&pcVar3[i_local].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
  pcVar4 = *(pointer *)((long)(pcVar3 + i_local) + 8);
  do {
    if (pcVar9 == pcVar4) {
      if ((this->TarjanEntries).
          super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
          ._M_impl.super__Vector_impl_data._M_start[i_local].Root == i_local) {
        pcVar5 = (this->Components).
                 super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pcVar6 = (this->Components).
                 super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::emplace_back<>
                  (&this->Components);
        iVar8 = (int)(((long)pcVar5 - (long)pcVar6) / 0x18);
        this_00 = &(this->Components).
                   super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar8].super_vector<int,_std::allocator<int>_>;
        do {
          piVar7 = (this->TarjanStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
          if (piVar7 == (this->TarjanStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_first) {
            piVar7 = (this->TarjanStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
          }
          j = piVar7[-1];
          std::deque<int,_std::allocator<int>_>::pop_back(&(this->TarjanStack).c);
          (this->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[j] = iVar8;
          (this->TarjanEntries).
          super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
          ._M_impl.super__Vector_impl_data._M_start[j].Root = i_local;
          std::vector<int,_std::allocator<int>_>::push_back(this_00,&j);
        } while (j != i_local);
        std::
        __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start,
                   (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish);
      }
      return;
    }
    iVar8 = pcVar9->Dest;
    iVar1 = (this->TarjanVisited).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar8];
    if (iVar1 < 1) {
      if (iVar1 == 0) {
        TarjanVisit(this,iVar8);
      }
LAB_0030e669:
      if ((this->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar8] < 0) {
        pTVar2 = (this->TarjanEntries).
                 super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pTVar2[pTVar2[iVar8].Root].VisitIndex < pTVar2[pTVar2[i_local].Root].VisitIndex) {
          pTVar2[i_local].Root = pTVar2[iVar8].Root;
        }
      }
    }
    else if (this->TarjanWalkId <= iVar1) goto LAB_0030e669;
    pcVar9 = pcVar9 + 1;
  } while( true );
}

Assistant:

void cmComputeComponentGraph::TarjanVisit(int i)
{
  // We are now visiting this node.
  this->TarjanVisited[i] = this->TarjanWalkId;

  // Initialize the entry.
  this->TarjanEntries[i].Root = i;
  this->TarjanComponents[i] = -1;
  this->TarjanEntries[i].VisitIndex = ++this->TarjanIndex;
  this->TarjanStack.push(i);

  // Follow outgoing edges.
  EdgeList const& nl = this->InputGraph[i];
  for (cmGraphEdge const& ni : nl) {
    int j = ni;

    // Ignore edges to nodes that have been reached by a previous DFS
    // walk.  Since we did not reach the current node from that walk
    // it must not belong to the same component and it has already
    // been assigned to a component.
    if (this->TarjanVisited[j] > 0 &&
        this->TarjanVisited[j] < this->TarjanWalkId) {
      continue;
    }

    // Visit the destination if it has not yet been visited.
    if (!this->TarjanVisited[j]) {
      this->TarjanVisit(j);
    }

    // If the destination has not yet been assigned to a component,
    // check if it has a better root for the current object.
    if (this->TarjanComponents[j] < 0) {
      if (this->TarjanEntries[this->TarjanEntries[j].Root].VisitIndex <
          this->TarjanEntries[this->TarjanEntries[i].Root].VisitIndex) {
        this->TarjanEntries[i].Root = this->TarjanEntries[j].Root;
      }
    }
  }

  // Check if we have found a component.
  if (this->TarjanEntries[i].Root == i) {
    // Yes.  Create it.
    int c = static_cast<int>(this->Components.size());
    this->Components.emplace_back();
    NodeList& component = this->Components[c];

    // Populate the component list.
    int j;
    do {
      // Get the next member of the component.
      j = this->TarjanStack.top();
      this->TarjanStack.pop();

      // Assign the member to the component.
      this->TarjanComponents[j] = c;
      this->TarjanEntries[j].Root = i;

      // Store the node in its component.
      component.push_back(j);
    } while (j != i);

    // Sort the component members for clarity.
    std::sort(component.begin(), component.end());
  }
}